

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  float *pfVar4;
  char *pcVar5;
  float *pfVar6;
  int iVar7;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float sumfp32_1;
  float scale_in_1;
  int i_1;
  char *m_1;
  char *w_1;
  int q;
  int offset;
  int sum_1;
  float *outptr_1;
  int p_1;
  float sumfp32;
  float scale_in;
  int i;
  int sum;
  char *kptr;
  int p;
  float *outptr;
  char *m;
  int j;
  Option opt_g;
  Mat bottom_blob_int8;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int num_input;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  Allocator *in_stack_fffffffffffffd58;
  size_t in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  float fVar13;
  Mat *in_stack_fffffffffffffd70;
  Mat *in_stack_fffffffffffffd78;
  float local_254;
  float local_1f4;
  float local_1f0;
  int local_1ec;
  Option *in_stack_fffffffffffffe48;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  int local_18c;
  int local_184;
  int local_174;
  float local_170;
  float local_16c;
  int local_168;
  int local_164;
  int local_154;
  int local_13c;
  Mat local_e8;
  int local_9c;
  long local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  Mat *local_78;
  long local_70;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Mat *local_40;
  undefined4 local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  undefined4 local_8;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  local_84 = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  local_88 = *(int *)(in_RSI + 0x2c);
  local_8c = *(int *)(in_RSI + 0x30);
  local_90 = *(int *)(in_RSI + 0x38);
  local_98 = *(long *)(in_RSI + 0x10);
  local_9c = local_88 * local_8c;
  local_78 = in_RDX;
  local_70 = in_RSI;
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (Mat *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  if (local_98 != 1) {
    quantize_to_int8(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  }
  if (((*(int *)(local_70 + 0x28) == 2) && (local_88 == local_84)) && (1 < local_8c)) {
    ncnn::Mat::create(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    if (bVar1) {
      local_60 = -100;
    }
    else {
      for (local_13c = 0; local_13c < local_8c; local_13c = local_13c + 1) {
        pcVar3 = ncnn::Mat::row<signed_char>(&local_e8,local_13c);
        pfVar4 = ncnn::Mat::row(local_78,local_13c);
        for (local_154 = 0; local_154 < *(int *)(in_RDI + 0xd0); local_154 = local_154 + 1) {
          pcVar5 = ncnn::Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x130));
          local_164 = 0;
          for (local_168 = 0; local_168 < local_88; local_168 = local_168 + 1) {
            local_164 = (int)pcVar3[local_168] *
                        (int)pcVar5[(long)local_168 + (long)(local_88 * local_154)] + local_164;
          }
          pfVar6 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_154);
          if ((*pfVar6 != 0.0) || (NAN(*pfVar6))) {
            pfVar6 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x208),0);
            fVar13 = *pfVar6;
            pfVar6 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_154);
            local_16c = 1.0 / (fVar13 * *pfVar6);
          }
          else {
            local_16c = 0.0;
          }
          local_170 = (float)local_164 * local_16c;
          if (*(int *)(in_RDI + 0xd4) != 0) {
            pfVar6 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x178),(long)local_154);
            local_170 = *pfVar6 + local_170;
          }
          local_8 = *(undefined4 *)(in_RDI + 0xe0);
          local_10 = (Mat *)(in_RDI + 0xe8);
          local_4 = local_170;
          switch(local_8) {
          case 1:
            dVar8 = std::fmax((double)(ulong)(uint)local_170,0.0);
            local_4 = SUB84(dVar8,0);
            break;
          case 2:
            pfVar6 = ncnn::Mat::operator[](local_10,0);
            local_14 = *pfVar6;
            if (local_4 <= 0.0) {
              local_254 = local_4 * local_14;
            }
            else {
              local_254 = local_4;
            }
            local_4 = local_254;
            break;
          case 3:
            pfVar6 = ncnn::Mat::operator[](local_10,0);
            local_18 = *pfVar6;
            pfVar6 = ncnn::Mat::operator[](local_10,1);
            local_1c = *pfVar6;
            if (local_4 < local_18) {
              local_4 = local_18;
            }
            if (local_1c < local_4) {
              local_4 = local_1c;
            }
            break;
          case 4:
            dVar8 = std::exp((double)(ulong)(uint)-local_170);
            local_4 = 1.0 / (SUB84(dVar8,0) + 1.0);
            break;
          case 5:
            auVar9._0_8_ = std::exp((double)(ulong)(uint)local_170);
            auVar9._8_8_ = extraout_XMM0_Qb;
            auVar10._4_12_ = auVar9._4_12_;
            auVar10._0_4_ = SUB84(auVar9._0_8_,0) + 1.0;
            dVar8 = std::log(auVar10._0_8_);
            dVar8 = std::tanh(dVar8);
            local_4 = local_170 * SUB84(dVar8,0);
            break;
          case 6:
            pfVar6 = ncnn::Mat::operator[](local_10,0);
            local_20 = *pfVar6;
            pfVar6 = ncnn::Mat::operator[](local_10,1);
            local_24 = *pfVar6;
            local_28 = -local_24 / local_20;
            local_2c = 1.0 / local_20 + local_28;
            if (local_28 <= local_4) {
              if (local_4 <= local_2c) {
                local_4 = local_4 * (local_4 * local_20 + local_24);
              }
            }
            else {
              local_4 = 0.0;
            }
          }
          pfVar4[local_154] = local_4;
        }
      }
      local_60 = 0;
    }
  }
  else {
    ncnn::Mat::create(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60,
                      in_stack_fffffffffffffd58);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    if (bVar1) {
      local_60 = -100;
    }
    else {
      for (local_174 = 0; local_174 < *(int *)(in_RDI + 0xd0); local_174 = local_174 + 1) {
        pfVar4 = ncnn::Mat::operator_cast_to_float_(local_78);
        local_184 = 0;
        iVar2 = local_9c * local_90;
        for (local_18c = 0; local_18c < local_90; local_18c = local_18c + 1) {
          pcVar3 = ncnn::Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x130));
          iVar7 = local_9c * local_18c;
          ncnn::Mat::channel(in_stack_fffffffffffffd78,
                             (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
          pcVar5 = ncnn::Mat::operator_cast_to_signed_char_((Mat *)&stack0xfffffffffffffe18);
          ncnn::Mat::~Mat((Mat *)0x39bb75);
          for (local_1ec = 0; local_1ec < local_9c; local_1ec = local_1ec + 1) {
            local_184 = (int)pcVar5[local_1ec] *
                        (int)pcVar3[(long)local_1ec + (long)iVar7 + (long)(iVar2 * local_174)] +
                        local_184;
          }
        }
        pfVar6 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_174);
        if ((*pfVar6 != 0.0) || (NAN(*pfVar6))) {
          in_stack_fffffffffffffd78 = (Mat *)ncnn::Mat::operator[]((Mat *)(in_RDI + 0x208),0);
          fVar13 = *(float *)&in_stack_fffffffffffffd78->data;
          in_stack_fffffffffffffd70 =
               (Mat *)ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_174);
          local_1f0 = 1.0 / (fVar13 * *(float *)&in_stack_fffffffffffffd70->data);
        }
        else {
          local_1f0 = 0.0;
        }
        local_1f4 = (float)local_184 * local_1f0;
        if (*(int *)(in_RDI + 0xd4) != 0) {
          pfVar6 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x178),(long)local_174);
          local_1f4 = *pfVar6 + local_1f4;
        }
        local_34 = *(undefined4 *)(in_RDI + 0xe0);
        local_40 = (Mat *)(in_RDI + 0xe8);
        local_30 = local_1f4;
        switch(local_34) {
        case 1:
          dVar8 = std::fmax((double)(ulong)(uint)local_1f4,0.0);
          local_30 = SUB84(dVar8,0);
          break;
        case 2:
          pfVar6 = ncnn::Mat::operator[](local_40,0);
          local_44 = *pfVar6;
          if (local_30 <= 0.0) {
            local_30 = local_30 * local_44;
          }
          break;
        case 3:
          pfVar6 = ncnn::Mat::operator[](local_40,0);
          local_48 = *pfVar6;
          pfVar6 = ncnn::Mat::operator[](local_40,1);
          local_4c = *pfVar6;
          if (local_30 < local_48) {
            local_30 = local_48;
          }
          if (local_4c < local_30) {
            local_30 = local_4c;
          }
          break;
        case 4:
          dVar8 = std::exp((double)(ulong)(uint)-local_1f4);
          local_30 = 1.0 / (SUB84(dVar8,0) + 1.0);
          break;
        case 5:
          auVar11._0_8_ = std::exp((double)(ulong)(uint)local_1f4);
          auVar11._8_8_ = extraout_XMM0_Qb_00;
          auVar12._4_12_ = auVar11._4_12_;
          auVar12._0_4_ = SUB84(auVar11._0_8_,0) + 1.0;
          dVar8 = std::log(auVar12._0_8_);
          dVar8 = std::tanh(dVar8);
          local_30 = local_1f4 * SUB84(dVar8,0);
          break;
        case 6:
          pfVar6 = ncnn::Mat::operator[](local_40,0);
          local_50 = *pfVar6;
          pfVar6 = ncnn::Mat::operator[](local_40,1);
          local_54 = *pfVar6;
          local_58 = -local_54 / local_50;
          local_5c = 1.0 / local_50 + local_58;
          if (local_58 <= local_30) {
            if (local_30 <= local_5c) {
              local_30 = local_30 * (local_30 * local_50 + local_54);
            }
          }
          else {
            local_30 = 0.0;
          }
        }
        pfVar4[local_174] = local_30;
      }
      local_60 = 0;
    }
  }
  ncnn::Mat::~Mat((Mat *)0x39c0b1);
  return local_60;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}